

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

ImportSourcePtr createBaseModelImport(ModelPtr *importModel,string *resourcePath)

{
  string *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ImportSourcePtr IVar2;
  string local_60 [32];
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> local_40;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  fileContents(local_60);
  libcellml::Parser::parseModel((string *)&local_40);
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)resourcePath,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__cxx11::string::~string(local_60);
  libcellml::ImportSource::create();
  psVar1 = (string *)
           (importModel->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"I_am_a_url",(allocator<char> *)&local_40);
  libcellml::ImportSource::setUrl(psVar1);
  std::__cxx11::string::~string(local_60);
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             (importModel->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  IVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)importModel;
  return (ImportSourcePtr)
         IVar2.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ImportSourcePtr createBaseModelImport(libcellml::ModelPtr &importModel, const std::string &resourcePath)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();

    importModel = parser->parseModel(fileContents(resourcePath));

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");
    import->setModel(importModel);

    return import;
}